

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_any(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  ly_stmt stmt;
  long local_d0;
  lysp_ext_instance *local_b0;
  lysp_ext_instance *local_a0;
  lysp_ext_instance *local_88;
  lysp_ext_instance *local_78;
  long local_58;
  long local_50;
  long *local_48;
  char *p__;
  uint64_t __u;
  LY_ERR ret;
  lysc_node_anydata *any;
  lysp_node_anydata *any_p;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  if (pnode[1].parent == (lysp_node *)0x0) {
LAB_00175359:
    __u._4_4_ = lysc_unres_must_add(ctx,node,pnode);
    if ((__u._4_4_ == LY_SUCCESS) && ((node->flags & 1) != 0)) {
      stmt = LY_STMT_ANYXML;
      if (node->nodetype == 0x60) {
        stmt = LY_STMT_ANYDATA;
      }
      pcVar6 = lyplg_ext_stmt2str(stmt);
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,
             "Use of %s to define configuration data is not recommended. %s",pcVar6,ctx->path);
    }
  }
  else {
    lVar1._0_2_ = node[1].nodetype;
    lVar1._2_2_ = node[1].flags;
    lVar1._4_1_ = node[1].hash[0];
    lVar1._5_1_ = node[1].hash[1];
    lVar1._6_1_ = node[1].hash[2];
    lVar1._7_1_ = node[1].hash[3];
    if (lVar1 == 0) {
      local_58 = 0;
    }
    else {
      lVar2._0_2_ = node[1].nodetype;
      lVar2._2_2_ = node[1].flags;
      lVar2._4_1_ = node[1].hash[0];
      lVar2._5_1_ = node[1].hash[1];
      lVar2._6_1_ = node[1].hash[2];
      lVar2._7_1_ = node[1].hash[3];
      if (lVar2 == 0) {
        local_50 = 0;
      }
      else {
        local_50 = *(long *)(*(long *)(node + 1) + -8);
      }
      local_58 = local_50;
    }
    lVar3._0_2_ = node[1].nodetype;
    lVar3._2_2_ = node[1].flags;
    lVar3._4_1_ = node[1].hash[0];
    lVar3._5_1_ = node[1].hash[1];
    lVar3._6_1_ = node[1].hash[2];
    lVar3._7_1_ = node[1].hash[3];
    if (lVar3 == 0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_88 = (lysp_ext_instance *)0x0;
      }
      else {
        local_88 = pnode[1].parent[-1].exts;
      }
      local_48 = (long *)calloc(1,((long)&local_88->name + local_58) * 0x38 + 8);
      if (local_48 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_any");
        return LY_EMEM;
      }
    }
    else {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_78 = (lysp_ext_instance *)0x0;
      }
      else {
        local_78 = pnode[1].parent[-1].exts;
      }
      local_48 = (long *)realloc((void *)(*(long *)(node + 1) + -8),
                                 ((long)&local_78->name +
                                 *(long *)(*(long *)(node + 1) + -8) + local_58) * 0x38 + 8);
      if (local_48 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_any");
        return LY_EMEM;
      }
    }
    *(long **)(node + 1) = local_48 + 1;
    lVar4._0_2_ = node[1].nodetype;
    lVar4._2_2_ = node[1].flags;
    lVar4._4_1_ = node[1].hash[0];
    lVar4._5_1_ = node[1].hash[1];
    lVar4._6_1_ = node[1].hash[2];
    lVar4._7_1_ = node[1].hash[3];
    if (lVar4 != 0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_a0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_a0 = pnode[1].parent[-1].exts;
      }
      memset((void *)(*(long *)(node + 1) + *local_48 * 0x38),0,
             ((long)&local_a0->name + local_58) * 0x38);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_b0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_b0 = pnode[1].parent[-1].exts;
      }
      if (local_b0 <= p__) goto LAB_00175359;
      *(long *)(*(long *)(node + 1) + -8) = *(long *)(*(long *)(node + 1) + -8) + 1;
      lVar5._0_2_ = node[1].nodetype;
      lVar5._2_2_ = node[1].flags;
      lVar5._4_1_ = node[1].hash[0];
      lVar5._5_1_ = node[1].hash[1];
      lVar5._6_1_ = node[1].hash[2];
      lVar5._7_1_ = node[1].hash[3];
      if (lVar5 == 0) {
        local_d0 = 0;
      }
      else {
        local_d0 = *(long *)(*(long *)(node + 1) + -8);
      }
      __u._4_4_ = lys_compile_must(ctx,(lysp_restr *)(pnode[1].parent + (long)p__),
                                   (lysc_must *)(*(long *)(node + 1) + (local_d0 + -1) * 0x38));
      if (__u._4_4_ != LY_SUCCESS) break;
      p__ = p__ + 1;
    }
  }
  return __u._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_any(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_anydata *any_p = (struct lysp_node_anydata *)pnode;
    struct lysc_node_anydata *any = (struct lysc_node_anydata *)node;
    LY_ERR ret = LY_SUCCESS;

    COMPILE_ARRAY_GOTO(ctx, any_p->musts, any->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    if (any->flags & LYS_CONFIG_W) {
        LOGVRB("Use of %s to define configuration data is not recommended. %s",
                lyplg_ext_stmt2str(any->nodetype == LYS_ANYDATA ? LY_STMT_ANYDATA : LY_STMT_ANYXML), ctx->path);
    }
done:
    return ret;
}